

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O1

bool __thiscall chrono::ChDirectSolverLS::SetupCurrent(ChDirectSolverLS *this)

{
  StorageIndex *pSVar1;
  int *piVar2;
  int iVar3;
  Scalar unVal;
  rep_conflict rVar4;
  long lVar5;
  ChLog *pCVar6;
  ChStreamOutAscii *pCVar7;
  scalar_sum_op<int,_int> local_51;
  Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_50;
  redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_38;
  
  rVar4 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_assembly).m_start.__d.__r = rVar4;
  Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&this->m_mat);
  lVar5 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_assembly).m_end.__d.__r = lVar5;
  (this->m_timer_setup_assembly).m_total.__r =
       (double)(lVar5 - (this->m_timer_setup_assembly).m_start.__d.__r) / 1000000000.0 +
       (this->m_timer_setup_assembly).m_total.__r;
  rVar4 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_solvercall).m_start.__d.__r = rVar4;
  iVar3 = (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xc])(this);
  lVar5 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_solvercall).m_end.__d.__r = lVar5;
  (this->m_timer_setup_solvercall).m_total.__r =
       (double)(lVar5 - (this->m_timer_setup_solvercall).m_start.__d.__r) / 1000000000.0 +
       (this->m_timer_setup_solvercall).m_total.__r;
  if ((this->super_ChSolverLS).super_ChSolver.verbose == true) {
    pCVar6 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<
                       (&pCVar6->super_ChStreamOutAscii," Solver SetupCurrent() [");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,this->m_setup_call);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,"] n = ");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,this->m_dim);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,"  nnz = ");
    pSVar1 = (this->m_mat).m_innerNonZeros;
    if (pSVar1 == (StorageIndex *)0x0) {
      piVar2 = (this->m_mat).m_outerIndex;
      unVal = piVar2[(this->m_mat).m_outerSize] - *piVar2;
    }
    else {
      lVar5 = (this->m_mat).m_outerSize;
      if (lVar5 == 0) {
        unVal = 0;
      }
      else {
        local_50.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = pSVar1;
        local_50.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = lVar5;
        if (lVar5 < 0) {
          __assert_fail("vecSize >= 0","/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xa6,
                        "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<int, -1, 1>>>::MapBase(PointerType, Index) [Derived = Eigen::Map<const Eigen::Matrix<int, -1, 1>>, Level = 0]"
                       );
        }
        local_38.
        super_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
        .
        super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
        .m_data = pSVar1;
        local_38.
        super_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
        .
        super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
        .m_outerStride.m_value = lVar5;
        unVal = Eigen::internal::
                redux_impl<Eigen::internal::scalar_sum_op<int,int>,Eigen::internal::redux_evaluator<Eigen::Map<Eigen::Matrix<int,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>,3,0>
                ::run<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                          (&local_38,&local_51,&local_50);
      }
    }
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,unVal);
    ChStreamOutAscii::operator<<(pCVar7,"\n");
    pCVar6 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"  assembly matrix:   ");
    lVar5 = std::chrono::_V2::system_clock::now();
    pCVar7 = ChStreamOutAscii::operator<<
                       (pCVar7,(double)(lVar5 - (this->m_timer_setup_assembly).m_start.__d.__r) /
                               1000000000.0);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,"s\n");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,"  analyze+factorize: ");
    lVar5 = std::chrono::_V2::system_clock::now();
    pCVar7 = ChStreamOutAscii::operator<<
                       (pCVar7,(double)(lVar5 - (this->m_timer_setup_solvercall).m_start.__d.__r) /
                               1000000000.0);
    ChStreamOutAscii::operator<<(pCVar7,"s\n");
  }
  this->m_setup_call = this->m_setup_call + 1;
  if (SUB41(iVar3,0) == false) {
    pCVar6 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"Solver SetupCurrent() failed\n");
    (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xe])(this);
  }
  return SUB41(iVar3,0);
}

Assistant:

bool ChDirectSolverLS::SetupCurrent() {
    m_timer_setup_assembly.start();

    // Allow the matrix to be compressed, if not yet compressed
    m_mat.makeCompressed();

    m_timer_setup_assembly.stop();

    // Let the concrete solver perform the factorization
    m_timer_setup_solvercall.start();
    bool result = FactorizeMatrix();
    m_timer_setup_solvercall.stop();

    if (verbose) {
        GetLog() << " Solver SetupCurrent() [" << m_setup_call << "] n = " << m_dim
                 << "  nnz = " << (int)m_mat.nonZeros() << "\n";
        GetLog() << "  assembly matrix:   " << m_timer_setup_assembly.GetTimeSecondsIntermediate() << "s\n"
                 << "  analyze+factorize: " << m_timer_setup_solvercall.GetTimeSecondsIntermediate() << "s\n";
    }

    m_setup_call++;

    if (!result) {
        // If the factorization failed, let the concrete solver display an error message.
        GetLog() << "Solver SetupCurrent() failed\n";
        PrintErrorMessage();
    }

    return result;
}